

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O1

int PrintFinalStats(void *mem)

{
  int iVar1;
  long ncfn;
  long netf;
  long nnf;
  long nreLS;
  long nre;
  long nje;
  long nni;
  long nst;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  IDAGetNumSteps(mem,&local_38);
  IDAGetNumResEvals(mem,&local_50);
  IDAGetNumJacEvals(mem,&local_48);
  IDAGetNumNonlinSolvIters(mem,&local_40);
  IDAGetNumErrTestFails(mem,&local_68);
  IDAGetNumNonlinSolvConvFails(mem,&local_60);
  IDAGetNumStepSolveFails(mem,&local_70);
  IDAGetNumLinResEvals(mem,&local_58);
  puts("\nFinal Run Statistics: \n");
  printf("Number of steps                    = %ld\n",local_38);
  printf("Number of residual evaluations     = %ld\n",local_58 + local_50);
  printf("Number of Jacobian evaluations     = %ld\n",local_48);
  printf("Number of nonlinear iterations     = %ld\n",local_40);
  printf("Number of error test failures      = %ld\n",local_68);
  printf("Number of nonlinear conv. failures = %ld\n",local_60);
  iVar1 = printf("Number of step solver failures     = %ld\n",local_70);
  return iVar1;
}

Assistant:

static int PrintFinalStats(void* mem)
{
  int retval;
  long int nst, nni, nnf, nje, nre, nreLS, netf, ncfn;

  retval = IDAGetNumSteps(mem, &nst);
  retval = IDAGetNumResEvals(mem, &nre);
  retval = IDAGetNumJacEvals(mem, &nje);
  retval = IDAGetNumNonlinSolvIters(mem, &nni);
  retval = IDAGetNumErrTestFails(mem, &netf);
  retval = IDAGetNumNonlinSolvConvFails(mem, &nnf);
  retval = IDAGetNumStepSolveFails(mem, &ncfn);
  retval = IDAGetNumLinResEvals(mem, &nreLS);

  printf("\nFinal Run Statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of Jacobian evaluations     = %ld\n", nje);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", nnf);
  printf("Number of step solver failures     = %ld\n", ncfn);

  return (retval);
}